

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

_Bool Curl_altsvc_lookup(altsvcinfo *asi,alpnid srcalpnid,char *srchost,int srcport,
                        altsvc **dstentry,int versions)

{
  altsvc *as_00;
  Curl_llist_element *pCVar1;
  int iVar2;
  time_t tVar3;
  altsvc *as;
  time_t now;
  Curl_llist_element *n;
  Curl_llist_element *e;
  int versions_local;
  altsvc **dstentry_local;
  int srcport_local;
  char *srchost_local;
  alpnid srcalpnid_local;
  altsvcinfo *asi_local;
  
  tVar3 = time((time_t *)0x0);
  n = (asi->list).head;
  do {
    while( true ) {
      if (n == (Curl_llist_element *)0x0) {
        return false;
      }
      as_00 = (altsvc *)n->ptr;
      pCVar1 = n->next;
      if (tVar3 <= as_00->expires) break;
      Curl_llist_remove(&asi->list,n,(void *)0x0);
      altsvc_free(as_00);
      n = pCVar1;
    }
    n = pCVar1;
  } while (((((as_00->src).alpnid != srcalpnid) ||
            (iVar2 = Curl_strcasecompare((as_00->src).host,srchost), iVar2 == 0)) ||
           ((uint)(as_00->src).port != srcport)) || ((versions & (as_00->dst).alpnid) == ALPN_none))
  ;
  *dstentry = as_00;
  return true;
}

Assistant:

bool Curl_altsvc_lookup(struct altsvcinfo *asi,
                        enum alpnid srcalpnid, const char *srchost,
                        int srcport,
                        struct altsvc **dstentry,
                        const int versions) /* one or more bits */
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  time_t now = time(NULL);
  DEBUGASSERT(asi);
  DEBUGASSERT(srchost);
  DEBUGASSERT(dstentry);

  for(e = asi->list.head; e; e = n) {
    struct altsvc *as = e->ptr;
    n = e->next;
    if(as->expires < now) {
      /* an expired entry, remove */
      Curl_llist_remove(&asi->list, e, NULL);
      altsvc_free(as);
      continue;
    }
    if((as->src.alpnid == srcalpnid) &&
       strcasecompare(as->src.host, srchost) &&
       (as->src.port == srcport) &&
       (versions & as->dst.alpnid)) {
      /* match */
      *dstentry = as;
      return TRUE;
    }
  }
  return FALSE;
}